

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O0

void __thiscall agge::tests::LayoutTests::TrivialLineFeedsDoNotProduceEmptyLines(LayoutTests *this)

{
  element_type *peVar1;
  __normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
  end;
  glyph *local_5a8;
  allocator local_569;
  string local_568;
  LocationInfo local_548;
  text_line *local_520;
  text_line *local_518;
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_510;
  int local_4f4 [7];
  vector<int,_std::allocator<int>_> local_4d8;
  vector<int,_std::allocator<int>_> local_4c0;
  vector<int,_std::allocator<int>_> local_4a8;
  vector<int,_std::allocator<int>_> local_490;
  vector<int,_std::allocator<int>_> local_478;
  vector<int,_std::allocator<int>_> local_460;
  vector<int,_std::allocator<int>_> local_448;
  undefined1 local_430 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_3e8;
  ref_text_line local_3d0;
  int local_3a8 [10];
  vector<int,_std::allocator<int>_> local_380;
  vector<int,_std::allocator<int>_> local_368;
  vector<int,_std::allocator<int>_> local_350;
  vector<int,_std::allocator<int>_> local_338;
  vector<int,_std::allocator<int>_> local_320;
  vector<int,_std::allocator<int>_> local_308;
  vector<int,_std::allocator<int>_> local_2f0;
  vector<int,_std::allocator<int>_> local_2d8;
  vector<int,_std::allocator<int>_> local_2c0;
  vector<int,_std::allocator<int>_> local_2a8;
  undefined1 local_290 [72];
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_248;
  ref_text_line local_230;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_208;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_1f0;
  allocator local_1d1;
  string local_1d0;
  richtext_t local_1b0;
  undefined1 local_148 [8];
  layout l;
  undefined1 local_e8 [8];
  factory_ptr f;
  glyph glyphs [4];
  char_to_index indices [4];
  LayoutTests *this_local;
  
  glyphs[3].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x20;
  f.super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x401c666666666666;
  glyphs[0].metrics.dx = 0.0;
  glyphs[0].metrics.dy = 0.0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[0].metrics.dy);
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4026000000000000;
  glyphs[1].metrics.dx = 0.0;
  glyphs[1].metrics.dy = 0.0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[1].metrics.dy);
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x402a000000000000;
  glyphs[2].metrics.dx = 0.0;
  glyphs[2].metrics.dy = 0.0;
  glyphs[2].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[2].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[2].metrics.dy);
  glyphs[2].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4031000000000000;
  glyphs[3].metrics.dx = 0.0;
  glyphs[3].metrics.dy = 0.0;
  glyphs[3].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[3].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[3].metrics.dy);
  end._M_current =
       (text_line *)
       &glyphs[3].outline.
        super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage;
  create_single_font_factory<4ul,4ul>
            ((LayoutTests *)local_e8,(font_metrics *)this,
             (char_to_index (*) [4])(anonymous_namespace)::c_fm1,(glyph (*) [4])end._M_current);
  layout::layout((layout *)local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"ABC CBA AB\n\n\nABB BBC\n\n",&local_1d1);
  R(&local_1b0,&local_1d0);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_e8);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)local_148,&local_1b0,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_e8);
  font_factory::operator*((font_factory *)local_290);
  local_3a8[9] = 1;
  plural_::operator+(&local_380,(plural_ *)&plural,local_3a8 + 9);
  local_3a8[8] = 2;
  tests::operator+(&local_368,&local_380,local_3a8 + 8);
  local_3a8[7] = 3;
  tests::operator+(&local_350,&local_368,local_3a8 + 7);
  local_3a8[6] = 0;
  tests::operator+(&local_338,&local_350,local_3a8 + 6);
  local_3a8[5] = 3;
  tests::operator+(&local_320,&local_338,local_3a8 + 5);
  local_3a8[4] = 2;
  tests::operator+(&local_308,&local_320,local_3a8 + 4);
  local_3a8[3] = 1;
  tests::operator+(&local_2f0,&local_308,local_3a8 + 3);
  local_3a8[2] = 0;
  tests::operator+(&local_2d8,&local_2f0,local_3a8 + 2);
  local_3a8[1] = 1;
  tests::operator+(&local_2c0,&local_2d8,local_3a8 + 1);
  local_3a8[0] = 2;
  tests::operator+(&local_2a8,&local_2c0,local_3a8);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_290 + 0x10),(shared_ptr<agge::font> *)local_290,0.0,0.0,
             &local_2a8);
  plural_::operator+(&local_248,(plural_ *)&plural,(ref_glyph_run *)(local_290 + 0x10));
  ref_text_line::ref_text_line(&local_230,0.0,10.0,0.0,&local_248);
  plural_::operator+(&local_208,(plural_ *)&plural,&local_230);
  std::
  __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_e8);
  font_factory::operator*((font_factory *)local_430);
  local_4f4[6] = 1;
  plural_::operator+(&local_4d8,(plural_ *)&plural,local_4f4 + 6);
  local_4f4[5] = 2;
  tests::operator+(&local_4c0,&local_4d8,local_4f4 + 5);
  local_4f4[4] = 2;
  tests::operator+(&local_4a8,&local_4c0,local_4f4 + 4);
  local_4f4[3] = 0;
  tests::operator+(&local_490,&local_4a8,local_4f4 + 3);
  local_4f4[2] = 2;
  tests::operator+(&local_478,&local_490,local_4f4 + 2);
  local_4f4[1] = 2;
  tests::operator+(&local_460,&local_478,local_4f4 + 1);
  local_4f4[0] = 3;
  tests::operator+(&local_448,&local_460,local_4f4);
  ref_glyph_run::ref_glyph_run<int>
            ((ref_glyph_run *)(local_430 + 0x10),(shared_ptr<agge::font> *)local_430,0.0,0.0,
             &local_448);
  plural_::operator+(&local_3e8,(plural_ *)&plural,(ref_glyph_run *)(local_430 + 0x10));
  ref_text_line::ref_text_line(&local_3d0,0.0,52.0,0.0,&local_3e8);
  tests::operator+(&local_1f0,&local_208,&local_3d0);
  local_518 = (text_line *)layout::begin((layout *)local_148);
  local_520 = (text_line *)layout::end((layout *)local_148);
  mkvector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>>
            (&local_510,(tests *)local_518,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_520,end);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_568,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_569);
  ut::LocationInfo::LocationInfo(&local_548,&local_568,0x15a);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_1f0,&local_510,&local_548);
  ut::LocationInfo::~LocationInfo(&local_548);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  std::vector<agge::text_line,_std::allocator<agge::text_line>_>::~vector(&local_510);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_1f0);
  ref_text_line::~ref_text_line(&local_3d0);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_3e8);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_430 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_448);
  std::vector<int,_std::allocator<int>_>::~vector(&local_460);
  std::vector<int,_std::allocator<int>_>::~vector(&local_478);
  std::vector<int,_std::allocator<int>_>::~vector(&local_490);
  std::vector<int,_std::allocator<int>_>::~vector(&local_4a8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_4c0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_4d8);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_430);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_208);
  ref_text_line::~ref_text_line(&local_230);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_248);
  ref_glyph_run::~ref_glyph_run((ref_glyph_run *)(local_290 + 0x10));
  std::vector<int,_std::allocator<int>_>::~vector(&local_2a8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2c0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2d8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2f0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_308);
  std::vector<int,_std::allocator<int>_>::~vector(&local_320);
  std::vector<int,_std::allocator<int>_>::~vector(&local_338);
  std::vector<int,_std::allocator<int>_>::~vector(&local_350);
  std::vector<int,_std::allocator<int>_>::~vector(&local_368);
  std::vector<int,_std::allocator<int>_>::~vector(&local_380);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_290);
  layout::~layout((layout *)local_148);
  std::shared_ptr<agge::tests::LayoutTests::font_factory>::~shared_ptr
            ((shared_ptr<agge::tests::LayoutTests::font_factory> *)local_e8);
  local_5a8 = (glyph *)&glyphs[3].outline.
                        super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_5a8 = local_5a8 + -1;
    mocks::font_accessor::glyph::~glyph(local_5a8);
  } while (local_5a8 !=
           (glyph *)&f.
                     super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
  return;
}

Assistant:

test( TrivialLineFeedsDoNotProduceEmptyLines )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L' ', 0 }, { L'A', 1 }, { L'B', 2 }, { L'C', 3 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 7.1, 0 } },
					{ { 11, 0 } },
					{ { 13, 0 } },
					{ { 17, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);

				// ACT
				layout l;

				l.process(R("ABC CBA AB\n\n\nABB BBC\n\n"), limit::none(), *f);

				// ASSERT
				assert_equal(plural
					+ ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 2 + 3 + 0 + 3 + 2 + 1 + 0 + 1 + 2))
					+ ref_text_line(0.0f, 52.0f, 0.0f, plural + ref_glyph_run(**f, 0.0f, 0.0f, plural + 1 + 2 + 2 + 0 + 2 + 2 + 3)),
					mkvector(l.begin(), l.end()));
			}